

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  byte bVar1;
  IConfig *pIVar2;
  long in_RDI;
  string *in_stack_ffffffffffffff18;
  StreamingReporterBase *in_stack_ffffffffffffff20;
  string local_b0 [32];
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  XmlWriter *in_stack_ffffffffffffff80;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase::testRunStarting
            (in_stack_ffffffffffffff20,(TestRunInfo *)in_stack_ffffffffffffff18);
  XmlWriter::setStream((XmlWriter *)(in_RDI + 0x1d8),*(ostream **)(in_RDI + 0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Catch",&local_31);
  XmlWriter::startElement((XmlWriter *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_68);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_68);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"name",(allocator *)&stack0xffffffffffffff77);
    pIVar2 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x10));
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_b0);
    XmlWriter::writeAttribute
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }